

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_frozen_serialize(void **param_1)

{
  roaring64_bitmap_t *r_00;
  uint64_t in_RDI;
  roaring64_bitmap_t *unaff_retaddr;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000080;
  uint64_t in_stack_ffffffffffffffe8;
  
  r_00 = roaring64_bitmap_create();
  check_frozen_serialization((roaring64_bitmap_t *)unaff_retaddr);
  roaring64_bitmap_add(unaff_retaddr,in_RDI);
  roaring64_bitmap_remove(unaff_retaddr,in_RDI);
  check_frozen_serialization((roaring64_bitmap_t *)unaff_retaddr);
  roaring64_bitmap_add(unaff_retaddr,in_RDI);
  roaring64_bitmap_add(unaff_retaddr,in_RDI);
  roaring64_bitmap_add(unaff_retaddr,in_RDI);
  roaring64_bitmap_add(unaff_retaddr,in_RDI);
  roaring64_bitmap_add(unaff_retaddr,in_RDI);
  roaring64_bitmap_add(unaff_retaddr,in_RDI);
  roaring64_bitmap_add(unaff_retaddr,in_RDI);
  check_frozen_serialization((roaring64_bitmap_t *)unaff_retaddr);
  roaring64_bitmap_add_range(r_00,in_stack_ffffffffffffffe8,0x107e0f);
  check_frozen_serialization((roaring64_bitmap_t *)unaff_retaddr);
  roaring64_bitmap_free(in_stack_00000080);
  return;
}

Assistant:

DEFINE_TEST(test_frozen_serialize) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();

    check_frozen_serialization(r);

    roaring64_bitmap_add(r, 0);
    roaring64_bitmap_remove(r, 0);
    check_frozen_serialization(r);

    roaring64_bitmap_add(r, 0);
    roaring64_bitmap_add(r, 1);
    roaring64_bitmap_add(r, 1ULL << 16);
    roaring64_bitmap_add(r, 1ULL << 32);
    roaring64_bitmap_add(r, 1ULL << 48);
    roaring64_bitmap_add(r, 1ULL << 60);
    roaring64_bitmap_add(r, UINT64_MAX);
    check_frozen_serialization(r);

    roaring64_bitmap_add_range(r, 1ULL << 16, 1ULL << 32);
    check_frozen_serialization(r);

    roaring64_bitmap_free(r);
}